

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O0

void write_file(bsdtar *bsdtar,archive *a,archive_entry *entry)

{
  archive_entry *entry_local;
  archive *a_local;
  bsdtar *bsdtar_local;
  
  write_entry(bsdtar,a,entry);
  return;
}

Assistant:

static void
write_file(struct bsdtar *bsdtar, struct archive *a,
    struct archive_entry *entry)
{
	write_entry(bsdtar, a, entry);
}